

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O0

void PutDword(UINT32 Data)

{
  UINT8 *pUVar1;
  UINT32 Data_local;
  
  if (mDst < mDstUpperLimit) {
    pUVar1 = mDst + 1;
    *mDst = (UINT8)Data;
    mDst = pUVar1;
  }
  if (mDst < mDstUpperLimit) {
    pUVar1 = mDst + 1;
    *mDst = (UINT8)(Data >> 8);
    mDst = pUVar1;
  }
  if (mDst < mDstUpperLimit) {
    pUVar1 = mDst + 1;
    *mDst = (UINT8)(Data >> 0x10);
    mDst = pUVar1;
  }
  if (mDst < mDstUpperLimit) {
    pUVar1 = mDst + 1;
    *mDst = (UINT8)(Data >> 0x18);
    mDst = pUVar1;
  }
  return;
}

Assistant:

STATIC
  VOID
  PutDword (
  UINT32 Data
  )
  /*++

  Routine Description:

  Put a DWORD to output stream

  Arguments:

  Data    - the DWORD to put

  Returns: (VOID)

  --*/
{
  if (mDst < mDstUpperLimit) {
    *mDst++ = (UINT8) (((UINT8) (Data)) & 0xff);
  }

  if (mDst < mDstUpperLimit) {
    *mDst++ = (UINT8) (((UINT8) (Data >> 0x08)) & 0xff);
  }

  if (mDst < mDstUpperLimit) {
    *mDst++ = (UINT8) (((UINT8) (Data >> 0x10)) & 0xff);
  }

  if (mDst < mDstUpperLimit) {
    *mDst++ = (UINT8) (((UINT8) (Data >> 0x18)) & 0xff);
  }
}